

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog.cpp
# Opt level: O3

void __thiscall
QPageSetupDialogPrivate::setPrinter(QPageSetupDialogPrivate *this,QPrinter *newPrinter)

{
  OutputFormat OVar1;
  bool bVar2;
  
  if ((this->printer != (QPrinter *)0x0) && (this->ownsPrinter == true)) {
    (**(code **)(*(long *)this->printer + 8))();
  }
  bVar2 = newPrinter == (QPrinter *)0x0;
  if (bVar2) {
    newPrinter = (QPrinter *)operator_new(0x20);
    QPrinter::QPrinter(newPrinter,ScreenResolution);
  }
  this->printer = newPrinter;
  this->ownsPrinter = bVar2;
  OVar1 = QPrinter::outputFormat(newPrinter);
  if (OVar1 != NativeFormat) {
    setPrinter();
  }
  return;
}

Assistant:

void QPageSetupDialogPrivate::setPrinter(QPrinter *newPrinter)
{
    if (printer && ownsPrinter)
        delete printer;

    if (newPrinter) {
        printer = newPrinter;
        ownsPrinter = false;
    } else {
        printer = new QPrinter;
        ownsPrinter = true;
    }
    if (printer->outputFormat() != QPrinter::NativeFormat)
        qWarning("QPageSetupDialog: Cannot be used on non-native printers");
}